

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void CostManagerClear(CostManager *manager)

{
  if (manager != (CostManager *)0x0) {
    WebPSafeFree(manager->costs);
    WebPSafeFree(manager->cache_intervals);
    DeleteIntervalList(manager,manager->head);
    manager->head = (CostInterval *)0x0;
    DeleteIntervalList(manager,manager->recycled_intervals);
    memset(manager,0,0x81c8);
    CostManagerInitFreeList(manager);
    return;
  }
  return;
}

Assistant:

static void CostManagerClear(CostManager* const manager) {
  if (manager == NULL) return;

  WebPSafeFree(manager->costs);
  WebPSafeFree(manager->cache_intervals);

  // Clear the interval lists.
  DeleteIntervalList(manager, manager->head);
  manager->head = NULL;
  DeleteIntervalList(manager, manager->recycled_intervals);
  manager->recycled_intervals = NULL;

  // Reset pointers, 'count' and 'cache_intervals_size'.
  memset(manager, 0, sizeof(*manager));
  CostManagerInitFreeList(manager);
}